

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O0

int skipEscapedLineEnds(char *buffer,int buffer_len,int offset,int *lines)

{
  int iVar1;
  bool bVar2;
  int *lines_local;
  int offset_local;
  int buffer_len_local;
  char *buffer_local;
  
  iVar1 = offset;
  while( true ) {
    offset_local = iVar1;
    bVar2 = false;
    if (((offset_local + 1 < buffer_len) && (bVar2 = false, buffer[offset_local] == '\\')) &&
       (bVar2 = true, buffer[offset_local + 1] != '\r')) {
      bVar2 = buffer[offset_local + 1] == '\n';
    }
    if (!bVar2) break;
    iVar1 = offset_local + 2;
    *lines = *lines + 1;
    if (((iVar1 < buffer_len) && (buffer[offset_local + 1] == '\r')) && (buffer[iVar1] == '\n')) {
      iVar1 = offset_local + 3;
    }
  }
  return offset_local;
}

Assistant:

static int skipEscapedLineEnds(const char *buffer, int buffer_len, int offset, int *lines)
{
    // Join physical lines to make logical lines, as in the C preprocessor
    while (offset + 1 < buffer_len
           && buffer[offset] == '\\'
           && qmake_endOfLine(buffer[offset + 1])) {
        offset += 2;
        ++*lines;
        if (offset < buffer_len
            && buffer[offset - 1] == '\r'
            && buffer[offset] == '\n') // CRLF
            offset++;
    }
    return offset;
}